

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O0

void sha1_end(uchar *hval,sha1_ctx *ctx)

{
  uint uVar1;
  __uint32_t _Var2;
  uint uVar3;
  uint local_20;
  uint local_1c;
  int _i;
  uint_32t i;
  sha1_ctx *ctx_local;
  uchar *hval_local;
  
  uVar1 = ctx->count[0] & 0x3f;
  local_20 = uVar1 + 3 >> 2;
  while (uVar3 = local_20 - 1, local_20 != 0) {
    _Var2 = __bswap_32(ctx->wbuf[(int)uVar3]);
    ctx->wbuf[(int)uVar3] = _Var2;
    local_20 = uVar3;
  }
  ctx->wbuf[uVar1 >> 2] = -0x80 << (sbyte)(((uVar1 ^ 0xffffffff) & 3) << 3) & ctx->wbuf[uVar1 >> 2];
  ctx->wbuf[uVar1 >> 2] = 0x80 << (sbyte)(((uVar1 ^ 0xffffffff) & 3) << 3) | ctx->wbuf[uVar1 >> 2];
  if (uVar1 < 0x38) {
    local_1c = (uVar1 >> 2) + 1;
  }
  else {
    if (uVar1 < 0x3c) {
      ctx->wbuf[0xf] = 0;
    }
    sha1_compile(ctx);
    local_1c = 0;
  }
  while (local_1c < 0xe) {
    ctx->wbuf[local_1c] = 0;
    local_1c = local_1c + 1;
  }
  ctx->wbuf[0xe] = ctx->count[1] << 3 | ctx->count[0] >> 0x1d;
  ctx->wbuf[0xf] = ctx->count[0] << 3;
  sha1_compile(ctx);
  for (local_1c = 0; local_1c < 0x14; local_1c = local_1c + 1) {
    hval[local_1c] =
         (uchar)(ctx->hash[local_1c >> 2] >> (sbyte)(((local_1c ^ 0xffffffff) & 3) << 3));
  }
  return;
}

Assistant:

VOID_RETURN sha1_end(unsigned char hval[], sha1_ctx ctx[1])
{   uint_32t    i = (uint_32t)(ctx->count[0] & SHA1_MASK);

    /* put bytes in the buffer in an order in which references to   */
    /* 32-bit words will put bytes with lower addresses into the    */
    /* top of 32 bit words on BOTH big and little endian machines   */
    bsw_32(ctx->wbuf, (i + 3) >> 2);

    /* we now need to mask valid bytes and add the padding which is */
    /* a single 1 bit and as many zero bits as necessary. Note that */
    /* we can always add the first padding byte here because the    */
    /* buffer always has at least one empty slot                    */
    ctx->wbuf[i >> 2] &= 0xffffff80 << 8 * (~i & 3);
    ctx->wbuf[i >> 2] |= 0x00000080 << 8 * (~i & 3);

    /* we need 9 or more empty positions, one for the padding byte  */
    /* (above) and eight for the length count. If there is not      */
    /* enough space, pad and empty the buffer                       */
    if(i > SHA1_BLOCK_SIZE - 9)
    {
        if(i < 60) ctx->wbuf[15] = 0;
        sha1_compile(ctx);
        i = 0;
    }
    else    /* compute a word index for the empty buffer positions  */
        i = (i >> 2) + 1;

    while(i < 14) /* and zero pad all but last two positions        */
        ctx->wbuf[i++] = 0;

    /* the following 32-bit length fields are assembled in the      */
    /* wrong byte order on little endian machines but this is       */
    /* corrected later since they are only ever used as 32-bit      */
    /* word values.                                                 */
    ctx->wbuf[14] = (ctx->count[1] << 3) | (ctx->count[0] >> 29);
    ctx->wbuf[15] = ctx->count[0] << 3;
    sha1_compile(ctx);

    /* extract the hash value as bytes in case the hash buffer is   */
    /* misaligned for 32-bit words                                  */
    for(i = 0; i < SHA1_DIGEST_SIZE; ++i)
        hval[i] = (unsigned char)(ctx->hash[i >> 2] >> (8 * (~i & 3)));
}